

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GRouter.cpp
# Opt level: O1

int CGRouter::ConcurrentRouting
              (CDesign *pDesign,vector<CWire_*,_std::allocator<CWire_*>_> *pWireList,int iMode)

{
  char cVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  CNet *pCVar5;
  CSegment *pCVar6;
  CPoint *pCVar7;
  CPoint *pCVar8;
  CBoundary *this;
  double dVar9;
  long lVar10;
  longlong lVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  undefined4 extraout_var;
  CLayer *pCVar17;
  reference pvVar18;
  vector<CSegment_*,_std::allocator<CSegment_*>_> *pvVar19;
  _Hashtable_node<std::pair<const_long_long,_int>_> *p_Var20;
  _Base_ptr p_Var21;
  FILE *__stream;
  char *pcVar22;
  CWire *pCVar23;
  pointer ppCVar24;
  _Hashtable_node<std::pair<const_long_long,_int>_> *p_Var25;
  int iVar26;
  CDesign *pCVar27;
  ulong uVar28;
  vector<CSegment_*,_std::allocator<CSegment_*>_> *pSegmentList;
  vector<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*>_>
  InverseVariable;
  CILPSolver ILPSolver;
  hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
  Variable;
  set<CBoundary_*,_std::less<CBoundary_*>,_std::allocator<CBoundary_*>_> Boundary;
  CBoundary *pBoundary;
  char cName [512];
  int local_534;
  CBoundary *local_528;
  CWire *local_520;
  vector<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*>_>
  local_518;
  long local_500;
  CDesign *local_4f8;
  _Rb_tree_node_base *local_4f0;
  undefined1 local_4e8 [56];
  double local_4b0;
  ulong local_4a8;
  ulong local_4a0;
  double local_498;
  hashtable<std::pair<const_long_long,_int>,_long_long,___gnu_cxx::hash<long_long>,_std::_Select1st<std::pair<const_long_long,_int>_>,_std::equal_to<long_long>,_std::allocator<int>_>
  local_490;
  _Rb_tree<CBoundary_*,_CBoundary_*,_std::_Identity<CBoundary_*>,_std::less<CBoundary_*>,_std::allocator<CBoundary_*>_>
  local_468;
  value_type local_438 [32];
  char local_238 [520];
  
  CILPSolver::CILPSolver((CILPSolver *)local_4e8);
  CILPSolver::Delete((CILPSolver *)local_4e8);
  local_4e8._48_8_ = &pDesign->field_0x234;
  pCVar27 = (CDesign *)local_4e8;
  CILPSolver::Create((CILPSolver *)pCVar27,(char *)local_4e8._48_8_);
  uVar14 = (uint)((ulong)((long)(pWireList->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>).
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(pWireList->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>).
                               _M_impl.super__Vector_impl_data._M_start) >> 3);
  if ((int)uVar14 < 1) {
    local_534 = 0;
  }
  else {
    uVar28 = 0;
    local_534 = 0;
    do {
      pCVar23 = (pWireList->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar28];
      if ((pCVar23 != (CWire *)0x0) && (iVar12 = FilterRouting(pCVar27,pCVar23), iVar12 != 0)) {
        (pWireList->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
        super__Vector_impl_data._M_start[uVar28] = (CWire *)0x0;
        local_534 = local_534 + 1;
      }
      uVar28 = uVar28 + 1;
    } while ((uVar14 & 0x7fffffff) != uVar28);
  }
  local_518.
  super__Vector_base<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_518.
  super__Vector_base<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (vector<CSegment_*,_std::allocator<CSegment_*>_> **)0x0;
  local_518.
  super__Vector_base<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (vector<CSegment_*,_std::allocator<CSegment_*>_> **)0x0;
  __gnu_cxx::
  hashtable<std::pair<const_long_long,_int>,_long_long,___gnu_cxx::hash<long_long>,_std::_Select1st<std::pair<const_long_long,_int>_>,_std::equal_to<long_long>,_std::allocator<int>_>
  ::hashtable(&local_490,100,(hash<long_long> *)local_438,(equal_to<long_long> *)&local_468,
              (allocator_type *)&local_528);
  local_468._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_468._M_impl.super__Rb_tree_header._M_header;
  local_468._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_468._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_468._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_468._M_impl.super__Rb_tree_header._M_header._M_right =
       local_468._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  vector<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*>_>
  ::reserve(&local_518,
            ((long)(pDesign->super_CBBox).m_cMaxZ - (long)(pDesign->super_CBBox).m_cMinZ) *
            ((long)(pWireList->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(pWireList->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 2));
  local_438[0].first = 0;
  if (local_518.
      super__Vector_base<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_518.
      super__Vector_base<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<std::vector<CSegment*,std::allocator<CSegment*>>*,std::allocator<std::vector<CSegment*,std::allocator<CSegment*>>*>>
    ::_M_realloc_insert<std::vector<CSegment*,std::allocator<CSegment*>>*>
              ((vector<std::vector<CSegment*,std::allocator<CSegment*>>*,std::allocator<std::vector<CSegment*,std::allocator<CSegment*>>*>>
                *)&local_518,
               (iterator)
               local_518.
               super__Vector_base<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (vector<CSegment_*,_std::allocator<CSegment_*>_> **)local_438);
  }
  else {
    *local_518.
     super__Vector_base<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*>_>
     ._M_impl.super__Vector_impl_data._M_finish =
         (vector<CSegment_*,_std::allocator<CSegment_*>_> *)0x0;
    local_518.
    super__Vector_base<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_518.
         super__Vector_base<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  uVar14 = (uint)((ulong)((long)(pWireList->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>).
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(pWireList->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>).
                               _M_impl.super__Vector_impl_data._M_start) >> 3);
  local_4f8 = pDesign;
  if (0 < (int)uVar14) {
    local_4a0 = (ulong)(uVar14 & 0x7fffffff);
    local_4b0 = 1.0;
    if ((iMode & 8U) != 0) {
      local_4b0 = 0.0;
    }
    local_498 = (double)(int)uVar14;
    uVar28 = 0;
    do {
      pCVar23 = (pWireList->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar28];
      if (pCVar23 != (CWire *)0x0) {
        if (((pCVar23->super_CObject).m_iState & 1) != 0) {
          __assert_fail("!pWire->IsRouted()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/GRouter.cpp"
                        ,0x71c,
                        "static int CGRouter::ConcurrentRouting(CDesign *, vector<CWire *> *, int)")
          ;
        }
        pCVar5 = (CNet *)(pCVar23->super_CObject).m_pParent;
        if (pCVar5 == (CNet *)0x0) {
          CWire::Delete(pCVar23);
          (pWireList->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
          super__Vector_impl_data._M_start[uVar28] = (CWire *)0x0;
          local_534 = local_534 + 1;
        }
        else {
          local_520 = pCVar23;
          iVar12 = CNet::IsRouted(pCVar5);
          if (iVar12 != 0) {
            __assert_fail("!pNet->IsRouted()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/GRouter.cpp"
                          ,0x72b,
                          "static int CGRouter::ConcurrentRouting(CDesign *, vector<CWire *> *, int)"
                         );
          }
          iVar12 = CWire::IsPoint(local_520);
          if (iVar12 != 0) {
            __assert_fail("!pWire->IsPoint()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/GRouter.cpp"
                          ,0x72c,
                          "static int CGRouter::ConcurrentRouting(CDesign *, vector<CWire *> *, int)"
                         );
          }
          CWire::Enumerate(local_520,1);
          iVar12 = CWire::GetNumSegmentList(local_520);
          local_500 = CONCAT44(extraout_var,iVar12);
          if (0 < iVar12) {
            iVar12 = 0;
            local_4a8 = uVar28;
            do {
              local_4f0 = (_Rb_tree_node_base *)CONCAT44(local_4f0._4_4_,iVar12);
              local_528 = (CBoundary *)CWire::GetSegmentList(local_520,iVar12);
              ppCVar24 = ((_Vector_impl_data *)
                         &(local_528->super_CPoint).super_CObject._vptr_CObject)->_M_start;
              if ((pointer)(local_528->super_CPoint).super_CObject.m_Key != ppCVar24) {
                uVar28 = 0;
                do {
                  pCVar6 = ppCVar24[uVar28];
                  local_438[0].first = 0;
                  iVar12 = CSegment::IsHorizontal(pCVar6);
                  if (iVar12 == 0) {
                    iVar12 = CSegment::IsVertical(pCVar6);
                    if (iVar12 == 0) {
                      __assert_fail("FALSE",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/GRouter.cpp"
                                    ,0x76b,
                                    "static int CGRouter::ConcurrentRouting(CDesign *, vector<CWire *> *, int)"
                                   );
                    }
                    pCVar7 = pCVar6->m_pPointE;
                    pCVar8 = pCVar6->m_pPointS;
                    sVar2 = pCVar8->m_iX;
                    if (sVar2 != pCVar7->m_iX) {
                      __assert_fail("pCurSegment->m_pPointS->X()==pCurSegment->m_pPointE->X()",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/GRouter.cpp"
                                    ,0x755,
                                    "static int CGRouter::ConcurrentRouting(CDesign *, vector<CWire *> *, int)"
                                   );
                    }
                    cVar1 = pCVar8->m_cZ;
                    if (cVar1 != pCVar7->m_cZ) {
                      __assert_fail("pCurSegment->m_pPointS->Z()==pCurSegment->m_pPointE->Z()",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/GRouter.cpp"
                                    ,0x756,
                                    "static int CGRouter::ConcurrentRouting(CDesign *, vector<CWire *> *, int)"
                                   );
                    }
                    sVar3 = pCVar8->m_iY;
                    iVar12 = (int)sVar3;
                    sVar4 = pCVar7->m_iY;
                    if (sVar4 < sVar3) {
                      __assert_fail("iMinY<=iMaxY",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/GRouter.cpp"
                                    ,0x75c,
                                    "static int CGRouter::ConcurrentRouting(CDesign *, vector<CWire *> *, int)"
                                   );
                    }
                    if (sVar3 < sVar4) {
                      do {
                        pCVar17 = CDesign::GetLayer(local_4f8,(int)cVar1);
                        local_438[0].first =
                             (longlong)CLayer::GetBoundary(pCVar17,(int)sVar2,iVar12);
                        if ((CBoundary *)local_438[0].first == (CBoundary *)0x0) {
                          __assert_fail("pBoundary",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/GRouter.cpp"
                                        ,0x761,
                                        "static int CGRouter::ConcurrentRouting(CDesign *, vector<CWire *> *, int)"
                                       );
                        }
                        iVar13 = CBoundary::IsFound((CBoundary *)local_438[0].first,pCVar5);
                        if (iVar13 == 0) {
                          CBoundary::AddSegmentList
                                    ((CBoundary *)local_438[0].first,
                                     (vector<CSegment_*,_std::allocator<CSegment_*>_> *)local_528);
                          std::
                          _Rb_tree<CBoundary*,CBoundary*,std::_Identity<CBoundary*>,std::less<CBoundary*>,std::allocator<CBoundary*>>
                          ::_M_insert_unique<CBoundary*const&>
                                    ((_Rb_tree<CBoundary*,CBoundary*,std::_Identity<CBoundary*>,std::less<CBoundary*>,std::allocator<CBoundary*>>
                                      *)&local_468,(CBoundary **)local_438);
                        }
                        iVar12 = iVar12 + 1;
                      } while (sVar4 != iVar12);
                    }
                  }
                  else {
                    pCVar7 = pCVar6->m_pPointE;
                    pCVar8 = pCVar6->m_pPointS;
                    sVar2 = pCVar8->m_iY;
                    if (sVar2 != pCVar7->m_iY) {
                      __assert_fail("pCurSegment->m_pPointS->Y()==pCurSegment->m_pPointE->Y()",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/GRouter.cpp"
                                    ,0x73d,
                                    "static int CGRouter::ConcurrentRouting(CDesign *, vector<CWire *> *, int)"
                                   );
                    }
                    cVar1 = pCVar8->m_cZ;
                    if (cVar1 != pCVar7->m_cZ) {
                      __assert_fail("pCurSegment->m_pPointS->Z()==pCurSegment->m_pPointE->Z()",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/GRouter.cpp"
                                    ,0x73e,
                                    "static int CGRouter::ConcurrentRouting(CDesign *, vector<CWire *> *, int)"
                                   );
                    }
                    sVar3 = pCVar8->m_iX;
                    iVar12 = (int)sVar3;
                    sVar4 = pCVar7->m_iX;
                    if (sVar4 < sVar3) {
                      __assert_fail("iMinX<=iMaxX",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/GRouter.cpp"
                                    ,0x744,
                                    "static int CGRouter::ConcurrentRouting(CDesign *, vector<CWire *> *, int)"
                                   );
                    }
                    if (sVar3 < sVar4) {
                      do {
                        pCVar17 = CDesign::GetLayer(local_4f8,(int)cVar1);
                        local_438[0].first =
                             (longlong)CLayer::GetBoundary(pCVar17,iVar12,(int)sVar2);
                        if ((CBoundary *)local_438[0].first == (CBoundary *)0x0) {
                          __assert_fail("pBoundary",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/GRouter.cpp"
                                        ,0x749,
                                        "static int CGRouter::ConcurrentRouting(CDesign *, vector<CWire *> *, int)"
                                       );
                        }
                        iVar13 = CBoundary::IsFound((CBoundary *)local_438[0].first,pCVar5);
                        if (iVar13 == 0) {
                          CBoundary::AddSegmentList
                                    ((CBoundary *)local_438[0].first,
                                     (vector<CSegment_*,_std::allocator<CSegment_*>_> *)local_528);
                          std::
                          _Rb_tree<CBoundary*,CBoundary*,std::_Identity<CBoundary*>,std::less<CBoundary*>,std::allocator<CBoundary*>>
                          ::_M_insert_unique<CBoundary*const&>
                                    ((_Rb_tree<CBoundary*,CBoundary*,std::_Identity<CBoundary*>,std::less<CBoundary*>,std::allocator<CBoundary*>>
                                      *)&local_468,(CBoundary **)local_438);
                        }
                        iVar12 = iVar12 + 1;
                      } while (sVar4 != iVar12);
                    }
                  }
                  uVar28 = uVar28 + 1;
                  ppCVar24 = ((_Vector_impl_data *)
                             &(local_528->super_CPoint).super_CObject._vptr_CObject)->_M_start;
                } while (uVar28 < (ulong)((long)(local_528->super_CPoint).super_CObject.m_Key -
                                          (long)ppCVar24 >> 3));
              }
              uVar28 = local_4a8;
              pDesign = local_4f8;
              if (((uint)iMode >> 0xc & 1) == 0) {
                if (((uint)iMode >> 0xd & 1) != 0) {
                  iVar12 = CILPSolver::GetNumVariable((CILPSolver *)local_4e8);
                  sprintf(local_238,"X%d",(ulong)(iVar12 + 1));
                }
              }
              else {
                local_238[0] = '\0';
              }
              if ((iMode & 8U) == 0) {
                if ((iMode & 0x14U) != 0) {
                  iVar12 = CILPSolver::AddVariable
                                     ((CILPSolver *)local_4e8,local_238,0.0,1,0.0,1,1.0);
                  local_438[0].first = (longlong)local_528;
                  local_438[0].second = 0;
                  pvVar18 = __gnu_cxx::
                            hashtable<std::pair<const_long_long,_int>,_long_long,___gnu_cxx::hash<long_long>,_std::_Select1st<std::pair<const_long_long,_int>_>,_std::equal_to<long_long>,_std::allocator<int>_>
                            ::find_or_insert(&local_490,local_438);
                  goto LAB_0010aaa4;
                }
              }
              else {
                dVar9 = 1.0;
                if ((pDesign->field_0xc51 & 4) != 0) {
                  dVar9 = CWire::GetSegmentListCost
                                    ((vector<CSegment_*,_std::allocator<CSegment_*>_> *)local_528);
                  dVar9 = (1.0 / dVar9) / local_498 + 1.0;
                }
                iVar12 = CILPSolver::AddVariable
                                   ((CILPSolver *)local_4e8,local_238,dVar9,1,0.0,1,1.0);
                local_438[0].first = (longlong)local_528;
                local_438[0].second = 0;
                pvVar18 = __gnu_cxx::
                          hashtable<std::pair<const_long_long,_int>,_long_long,___gnu_cxx::hash<long_long>,_std::_Select1st<std::pair<const_long_long,_int>_>,_std::equal_to<long_long>,_std::allocator<int>_>
                          ::find_or_insert(&local_490,local_438);
LAB_0010aaa4:
                pvVar18->second = iVar12;
              }
              if (local_518.
                  super__Vector_base<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish ==
                  local_518.
                  super__Vector_base<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<std::vector<CSegment*,std::allocator<CSegment*>>*,std::allocator<std::vector<CSegment*,std::allocator<CSegment*>>*>>
                ::_M_realloc_insert<std::vector<CSegment*,std::allocator<CSegment*>>*const&>
                          ((vector<std::vector<CSegment*,std::allocator<CSegment*>>*,std::allocator<std::vector<CSegment*,std::allocator<CSegment*>>*>>
                            *)&local_518,
                           (iterator)
                           local_518.
                           super__Vector_base<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish,
                           (vector<CSegment_*,_std::allocator<CSegment_*>_> **)&local_528);
              }
              else {
                *local_518.
                 super__Vector_base<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish =
                     (vector<CSegment_*,_std::allocator<CSegment_*>_> *)local_528;
                local_518.
                super__Vector_base<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     local_518.
                     super__Vector_base<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 1;
              }
              iVar12 = (int)local_4f0 + 1;
            } while (iVar12 != (int)local_500);
          }
          CILPSolver::PrepareCoeffBuffer
                    ((CILPSolver *)local_4e8,(int)local_500 + 1,(int)local_490._M_num_elements);
          lVar10 = local_500;
          if (((uint)iMode >> 0xc & 1) == 0) {
            if (((uint)iMode >> 0xd & 1) != 0) {
              iVar12 = CILPSolver::GetNumConstraint((CILPSolver *)local_4e8);
              sprintf(local_238,"Z%d",(ulong)(iVar12 + 1));
            }
          }
          else {
            local_238[0] = '\0';
          }
          if ((iMode & 0x1cU) != 0) {
            CILPSolver::AddConstraint
                      ((CILPSolver *)local_4e8,local_238,(int)lVar10,1,local_4b0,1,1.0);
          }
        }
      }
      uVar28 = uVar28 + 1;
    } while (uVar28 != local_4a0);
  }
  std::
  vector<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*>_>
  ::resize(&local_518,
           (long)local_518.
                 super__Vector_base<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_518.
                 super__Vector_base<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3);
  lVar10 = CONCAT44(local_490._M_num_elements._4_4_,(int)local_490._M_num_elements);
  if (lVar10 != ((long)local_518.
                       super__Vector_base<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_518.
                       super__Vector_base<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) + -1) {
    __assert_fail("Variable.size()==InverseVariable.size()-1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/GRouter.cpp"
                  ,0x7b1,"static int CGRouter::ConcurrentRouting(CDesign *, vector<CWire *> *, int)"
                 );
  }
  iVar12 = -1;
  if ((((iMode & 8U) == 0) && ((iMode & 0x14U) != 0)) &&
     (iVar12 = CILPSolver::AddVariable((CILPSolver *)local_4e8,"v-D",1.0,1,0.0,0,2139062143.0),
     (iMode & 0x10U) != 0)) {
    CILPSolver::SetCoeffIndex((CILPSolver *)local_4e8,1,iVar12);
    iVar13 = CDesign::GetCapacity(pDesign,0x40);
    CILPSolver::AddConstraint((CILPSolver *)local_4e8,"c-D",1,1,0.0,1,(double)(iVar13 + 1));
  }
  local_520 = (CWire *)CONCAT44(local_520._4_4_,iVar12);
  local_500 = lVar10;
  if ((_Rb_tree_header *)local_468._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_468._M_impl.super__Rb_tree_header) {
    p_Var21 = local_468._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      this = *(CBoundary **)(p_Var21 + 1);
      local_4f0 = p_Var21;
      iVar13 = CBoundary::GetNumSegmentList(this);
      CILPSolver::PrepareCoeffBuffer((CILPSolver *)local_4e8,iVar13 + 2,0);
      iVar26 = 0;
      iVar12 = 0;
      if (0 < iVar13) {
        iVar12 = iVar13;
      }
      while (iVar26 != iVar12) {
        pvVar19 = CBoundary::GetSegmentList(this,iVar26);
        p_Var20 = (_Hashtable_node<std::pair<const_long_long,_int>_> *)
                  (local_490._M_buckets.
                   super__Vector_base<__gnu_cxx::_Hashtable_node<std::pair<const_long_long,_int>_>_*,_std::allocator<__gnu_cxx::_Hashtable_node<std::pair<const_long_long,_int>_>_*>_>
                   ._M_impl.super__Vector_impl_data._M_start +
                  (ulong)pvVar19 %
                  (ulong)((long)local_490._M_buckets.
                                super__Vector_base<__gnu_cxx::_Hashtable_node<std::pair<const_long_long,_int>_>_*,_std::allocator<__gnu_cxx::_Hashtable_node<std::pair<const_long_long,_int>_>_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_490._M_buckets.
                                super__Vector_base<__gnu_cxx::_Hashtable_node<std::pair<const_long_long,_int>_>_*,_std::allocator<__gnu_cxx::_Hashtable_node<std::pair<const_long_long,_int>_>_*>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3));
        p_Var25 = p_Var20;
        do {
          p_Var25 = p_Var25->_M_next;
          if (p_Var25 == (_Hashtable_node<std::pair<const_long_long,_int>_> *)0x0) {
            __assert_fail("Variable.find((ADDRESS)pSegmentList)!=Variable.end()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/GRouter.cpp"
                          ,0x7d4,
                          "static int CGRouter::ConcurrentRouting(CDesign *, vector<CWire *> *, int)"
                         );
          }
        } while ((vector<CSegment_*,_std::allocator<CSegment_*>_> *)(p_Var25->_M_val).first !=
                 pvVar19);
        iVar26 = iVar26 + 1;
        do {
          p_Var20 = p_Var20->_M_next;
          if (p_Var20 == (_Hashtable_node<std::pair<const_long_long,_int>_> *)0x0) break;
        } while ((vector<CSegment_*,_std::allocator<CSegment_*>_> *)(p_Var20->_M_val).first !=
                 pvVar19);
        CILPSolver::SetCoeffIndex((CILPSolver *)local_4e8,iVar26,(p_Var20->_M_val).second);
        CILPSolver::SetCoeff((CILPSolver *)local_4e8,iVar26,2);
      }
      if (((uint)iMode >> 0xc & 1) == 0) {
        if (((uint)iMode >> 0xd & 1) != 0) {
          uVar14 = CILPSolver::GetNumConstraint((CILPSolver *)local_4e8);
          sprintf(local_238,"Y%d",(ulong)uVar14);
        }
      }
      else {
        local_238[0] = '\0';
      }
      if ((iMode & 8U) == 0) {
        if ((iMode & 0x14U) != 0) {
          if ((int)local_520 < 1) {
            __assert_fail("iD>0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/GRouter.cpp"
                          ,0x7ef,
                          "static int CGRouter::ConcurrentRouting(CDesign *, vector<CWire *> *, int)"
                         );
          }
          iVar26 = iVar26 + 1;
          CILPSolver::SetCoeffIndex((CILPSolver *)local_4e8,iVar26,(int)local_520);
          pCVar17 = CBoundary::GetParent(this);
          iVar12 = CLayer::GetCapacity(pCVar17,0x40);
          iVar15 = CDesign::GetCapacity(local_4f8,0x40);
          CILPSolver::SetCoeff((CILPSolver *)local_4e8,iVar26,-(double)iVar12 / (double)iVar15);
          iVar12 = CBoundary::GetCapacity(this,0x2000);
          CILPSolver::AddConstraint
                    ((CILPSolver *)local_4e8,local_238,iVar13 + 1,0,0.0,1,(double)-iVar12);
          CILPSolver::SetCoeff((CILPSolver *)local_4e8,iVar26,1);
        }
      }
      else {
        if ((int)local_520 != -1) {
          __assert_fail("iD==-1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/GRouter.cpp"
                        ,0x7ea,
                        "static int CGRouter::ConcurrentRouting(CDesign *, vector<CWire *> *, int)")
          ;
        }
        iVar12 = CBoundary::GetCapacity(this,0x1000);
        CILPSolver::AddConstraint((CILPSolver *)local_4e8,local_238,iVar13,1,0.0,1,(double)iVar12);
      }
      CBoundary::ClearSegmentList(this);
      iVar12 = CBoundary::GetNumSegmentList(this);
      if (iVar12 != 0) {
        __assert_fail("pBoundary->GetNumSegmentList()==0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/GRouter.cpp"
                      ,0x7fa,
                      "static int CGRouter::ConcurrentRouting(CDesign *, vector<CWire *> *, int)");
      }
      p_Var21 = (_Base_ptr)std::_Rb_tree_increment(local_4f0);
    } while ((_Rb_tree_header *)p_Var21 != &local_468._M_impl.super__Rb_tree_header);
  }
  uVar14 = CILPSolver::GetNumVariable((CILPSolver *)local_4e8);
  pCVar27 = local_4f8;
  uVar16 = CILPSolver::GetNumConstraint((CILPSolver *)local_4e8);
  CObject::PrintMsg2("..#v=%d #c=%d ",(ulong)uVar14,(ulong)uVar16);
  if (((uint)iMode >> 0xc & 1) == 0) {
    if (((uint)iMode >> 0xd & 1) != 0) {
      sprintf(local_238,"%s_l%d.mps",local_4e8._48_8_,(ulong)(pCVar27->m_iLoop - 1));
      CILPSolver::Write((CILPSolver *)local_4e8,local_238,1);
      sprintf((char *)local_438,
              "mosek -max %s -d MSK_IPAR_READ_MPS_FORMAT 2 -d MSK_IPAR_WRITE_SOL_CONSTRAINTS 0 -d MSK_IPAR_WRITE_BAS_CONSTRAINTS 0 -d MSK_IPAR_WRITE_BAS_HEAD 0 -d MSK_IPAR_WRITE_BAS_VARIABLES 0 -d MSK_IPAR_LOG 0"
              ,local_238);
      CreateAndWait((char *)local_438);
      sprintf(local_238,"%s_l%d.sol",local_4e8._48_8_,(ulong)(pCVar27->m_iLoop - 1));
      __stream = fopen(local_238,"rt");
      pcVar22 = fgets((char *)local_438,0x200,__stream);
      if (pcVar22 != (char *)0x0) {
        do {
          strtok((char *)local_438," \t\n");
          pcVar22 = strtok((char *)0x0," \t\n");
          if ((pcVar22 != (char *)0x0) && (*pcVar22 == 'X')) {
            iVar12 = atoi(pcVar22 + 1);
            strtok((char *)0x0," \t\n");
            pcVar22 = strtok((char *)0x0," \t\n");
            dVar9 = atof(pcVar22);
            if (0.5 <= dVar9) {
              pCVar6 = *(local_518.
                         super__Vector_base<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*>_>
                         ._M_impl.super__Vector_impl_data._M_start[iVar12]->
                        super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>)._M_impl.
                        super__Vector_impl_data._M_start;
              pCVar23 = CSegment::GetParent(pCVar6);
              if (pCVar23->m_pRoutedSegmentList !=
                  (vector<CSegment_*,_std::allocator<CSegment_*>_> *)0x0) {
                __assert_fail("pSegment->GetParent()->m_pRoutedSegmentList==NULL",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/GRouter.cpp"
                              ,0x873,
                              "static int CGRouter::ConcurrentRouting(CDesign *, vector<CWire *> *, int)"
                             );
              }
              pvVar19 = local_518.
                        super__Vector_base<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[iVar12];
              pCVar23 = CSegment::GetParent(pCVar6);
              pCVar23->m_pRoutedSegmentList = pvVar19;
              pCVar23 = CSegment::GetParent(pCVar6);
              if ((pCVar23->m_pRoutedSegmentList->
                  super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>)._M_impl.
                  super__Vector_impl_data._M_finish ==
                  (pCVar23->m_pRoutedSegmentList->
                  super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>)._M_impl.
                  super__Vector_impl_data._M_start) {
                __assert_fail("pSegment->GetParent()->m_pRoutedSegmentList->size()",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/GRouter.cpp"
                              ,0x875,
                              "static int CGRouter::ConcurrentRouting(CDesign *, vector<CWire *> *, int)"
                             );
              }
            }
          }
          pcVar22 = fgets((char *)local_438,0x200,__stream);
        } while (pcVar22 != (char *)0x0);
      }
    }
    goto LAB_0010b212;
  }
  if ((iMode & 8U) == 0) {
    if ((iMode & 4U) != 0) {
      iVar13 = 0x2100000;
      iVar12 = 0x2010000;
      goto LAB_0010b0e0;
    }
    iVar12 = 0;
    if ((iMode & 0x10U) != 0) {
      if ((iMode & 0x20U) == 0) {
        iVar13 = CILPSolver::GetNumConstraint((CILPSolver *)local_4e8);
        iVar12 = 0x2100000;
      }
      else {
        iVar13 = CILPSolver::GetNumConstraint((CILPSolver *)local_4e8);
        iVar12 = 0x2010000;
      }
      if (20000 < iVar13) {
        iVar12 = 0;
      }
    }
  }
  else {
    iVar13 = 0x1100000;
    iVar12 = 0x1010000;
LAB_0010b0e0:
    if ((iMode & 0x20U) == 0) {
      iVar12 = iVar13;
    }
  }
  if (iVar12 == 0) {
    CObject::PrintMsg2("\t= discarded (maxc %d)\n",20000);
  }
  else {
    local_438[0].first = 0;
    CILPSolver::PrepareSolutionBuffer
              ((CILPSolver *)local_4e8,
               (int)((ulong)((long)local_518.
                                   super__Vector_base<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_518.
                                  super__Vector_base<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3));
    iVar12 = CILPSolver::Solve((CILPSolver *)local_4e8,iVar12,(double *)local_438);
    if (iVar12 != 0) {
      CObject::PrintMsg2("*o=%.2f\t",(int)local_438[0].first);
      if ((iMode & 0x20U) != 0) {
        CILPSolver::RoundUp((CILPSolver *)local_4e8,0.5);
      }
      lVar11 = local_438[0].first;
      if (((iMode & 0x10U) == 0) ||
         (iVar12 = CDesign::GetCapacity(pCVar27,0x40), (int)(double)lVar11 <= iVar12)) {
        if (0 < (int)local_500) {
          uVar28 = 1;
          do {
            dVar9 = CILPSolver::GetSolution((CILPSolver *)local_4e8,(int)uVar28);
            if ((dVar9 != 0.0) || (NAN(dVar9))) {
              pvVar19 = local_518.
                        super__Vector_base<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar28];
              pCVar6 = *(pvVar19->super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>).
                        _M_impl.super__Vector_impl_data._M_start;
              pCVar23 = CSegment::GetParent(pCVar6);
              pCVar23->m_pRoutedSegmentList = pvVar19;
              pCVar23 = CSegment::GetParent(pCVar6);
              if ((pCVar23->m_pRoutedSegmentList->
                  super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>)._M_impl.
                  super__Vector_impl_data._M_finish ==
                  (pCVar23->m_pRoutedSegmentList->
                  super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>)._M_impl.
                  super__Vector_impl_data._M_start) {
                __assert_fail("pSegment->GetParent()->m_pRoutedSegmentList->size()",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/GRouter.cpp"
                              ,0x83e,
                              "static int CGRouter::ConcurrentRouting(CDesign *, vector<CWire *> *, int)"
                             );
              }
            }
            uVar28 = uVar28 + 1;
          } while ((int)local_500 + 1 != uVar28);
        }
      }
      else {
        CObject::PrintMsg2("=give up solution\n");
      }
    }
  }
LAB_0010b212:
  uVar14 = (uint)((ulong)((long)(pWireList->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>).
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(pWireList->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>).
                               _M_impl.super__Vector_impl_data._M_start) >> 3);
  if (0 < (int)uVar14) {
    uVar28 = 0;
    do {
      pCVar23 = (pWireList->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar28];
      if (pCVar23 != (CWire *)0x0) {
        pCVar5 = (CNet *)(pCVar23->super_CObject).m_pParent;
        if (pCVar5 == (CNet *)0x0) {
          CWire::Delete(pCVar23);
          (pWireList->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
          super__Vector_impl_data._M_start[uVar28] = (CWire *)0x0;
        }
        else {
          pvVar19 = pCVar23->m_pRoutedSegmentList;
          if (pvVar19 == (vector<CSegment_*,_std::allocator<CSegment_*>_> *)0x0) {
            CWire::ClearSegmentList(pCVar23);
            goto LAB_0010b2b5;
          }
          if ((pvVar19->super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>)._M_impl.
              super__Vector_impl_data._M_finish ==
              (pvVar19->super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>)._M_impl.
              super__Vector_impl_data._M_start) {
            __assert_fail("pWire->m_pRoutedSegmentList->size()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/GRouter.cpp"
                          ,0x895,
                          "static int CGRouter::ConcurrentRouting(CDesign *, vector<CWire *> *, int)"
                         );
          }
          CWire::Pupate(pCVar23);
          CWire::Delete(pCVar23);
          (pWireList->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
          super__Vector_impl_data._M_start[uVar28] = (CWire *)0x0;
          CNet::Refine(pCVar5);
        }
        local_534 = local_534 + 1;
      }
LAB_0010b2b5:
      uVar28 = uVar28 + 1;
    } while ((uVar14 & 0x7fffffff) != uVar28);
  }
  std::
  _Rb_tree<CBoundary_*,_CBoundary_*,_std::_Identity<CBoundary_*>,_std::less<CBoundary_*>,_std::allocator<CBoundary_*>_>
  ::~_Rb_tree(&local_468);
  __gnu_cxx::
  hashtable<std::pair<const_long_long,_int>,_long_long,___gnu_cxx::hash<long_long>,_std::_Select1st<std::pair<const_long_long,_int>_>,_std::equal_to<long_long>,_std::allocator<int>_>
  ::~hashtable(&local_490);
  if (local_518.
      super__Vector_base<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_518.
                    super__Vector_base<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_518.
                          super__Vector_base<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_518.
                          super__Vector_base<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  CILPSolver::~CILPSolver((CILPSolver *)local_4e8);
  return local_534;
}

Assistant:

int CGRouter::ConcurrentRouting(CDesign* pDesign, vector<CWire*>* pWireList, int iMode)
{
	// make ILP solver ready [6/22/2006 thyeros]
	CILPSolver ILPSolver;
	
	ILPSolver.Delete();
	ILPSolver.Create((char*)pDesign->m_Param.m_cInput_File);

	char cName[MAX_BUFFER_STR];

	int	i,j,k,x,y,s,iD,iNumVariable;
	int	iNumWireRouted		=	0;

	//////////////////////////////////////////////////////////////////////////
	// filtering the already routed wires [7/7/2006 thyeros]
	//////////////////////////////////////////////////////////////////////////
	for(i=0,s=pWireList->size();i<s;++i)
	{
		CWire*	pWire	=	(*pWireList)[i];
		if(pWire==NULL)	continue;
		
		if(FilterRouting(pDesign,pWire))
		{	
			// mark it is routed and DELETED [6/23/2006 thyeros]
			(*pWireList)[i]	=	NULL;
			
			++iNumWireRouted;			
		}
	}

	vector<vector<CSegment*>* >		InverseVariable;
	hash_map<ADDRESS, int>				Variable;
	set<CBoundary*>					Boundary;

	InverseVariable.reserve(pWireList->size()*2*pDesign->T());

	//thyeros: make the first empty as GLPK is doing [10/29/2005]
	InverseVariable.push_back((vector<CSegment*>*)NULL);
	
	//////////////////////////////////////////////////////////////////////////
	// variable constraints [6/24/2006 thyeros]
	// set objective function [6/24/2006 thyeros]
	//////////////////////////////////////////////////////////////////////////
	for(i=0,s=pWireList->size();i<s;++i)
	{
		CWire*	pWire	=	(*pWireList)[i];
		if(pWire==NULL)	continue;

		assert(!pWire->IsRouted());

		CNet*	pNet	=	pWire->GetParent();
		// it is deleted from the net [7/1/2006 thyeros]
		if(pNet==NULL)
		{
			pWire->Delete();//SAFE_DEL(pWire);
			// mark it is routed and DELETED [6/23/2006 thyeros]
			(*pWireList)[i]	=	NULL;			
			++iNumWireRouted;

			continue;
		}
		
		assert(pNet);
		assert(!pNet->IsRouted());
		assert(!pWire->IsPoint());

		pWire->Enumerate(ENUM_MODE_L);
		
		int	iNumSegmentList	=	pWire->GetNumSegmentList();
		
		for(j=0;j<iNumSegmentList;++j)
		{		
			vector<CSegment*>*	pSegmentList	=	pWire->GetSegmentList(j);
			for (k=0;k<pSegmentList->size();k++)
			{
				CSegment*	pCurSegment	=	(*pSegmentList)[k];
				CBoundary*	pBoundary	=	NULL;
				CGrid*		pGrid		=	NULL;
				
				if(pCurSegment->IsHorizontal())
				{
					assert(pCurSegment->m_pPointS->Y()==pCurSegment->m_pPointE->Y());
					assert(pCurSegment->m_pPointS->Z()==pCurSegment->m_pPointE->Z());
					int iZ		=	pCurSegment->m_pPointS->Z();
					int	iY		=	pCurSegment->m_pPointS->Y();
					int	iMinX	=	pCurSegment->m_pPointS->X();
					int	iMaxX	=	pCurSegment->m_pPointE->X();
					
					assert(iMinX<=iMaxX);
					
					for (x=iMinX;x<iMaxX;x++)
					{
						pBoundary	=	pDesign->GetLayer(iZ)->GetBoundary(x,iY);					
						assert(pBoundary);
						
						if(pBoundary->IsFound(pNet))	continue;

						pBoundary->AddSegmentList(pSegmentList);
						//Boundary[pBoundary->GetKey()]	=	pBoundary;

						Boundary.insert(pBoundary);
					}
				}
				else if(pCurSegment->IsVertical())
				{
					assert(pCurSegment->m_pPointS->X()==pCurSegment->m_pPointE->X());
					assert(pCurSegment->m_pPointS->Z()==pCurSegment->m_pPointE->Z());
					int iZ		=	pCurSegment->m_pPointS->Z();
					int	iX		=	pCurSegment->m_pPointS->X();
					int	iMinY	=	pCurSegment->m_pPointS->Y();
					int	iMaxY	=	pCurSegment->m_pPointE->Y();
					
					assert(iMinY<=iMaxY);
					
					for (y=iMinY;y<iMaxY;y++)
					{
						pBoundary	=	pDesign->GetLayer(iZ)->GetBoundary(iX,y);						
						assert(pBoundary);
						
						if(pBoundary->IsFound(pNet))	continue;

						pBoundary->AddSegmentList(pSegmentList);
						Boundary.insert(pBoundary);
					}
				}
				else
				{
					assert(FALSE);
				}
			}// for each segment [6/22/2006 thyeros]
				
			if(iMode&PROP_PARAM_SOLVER_GLPK)
			{
#ifdef _DEBUG
				sprintf(cName,"v-seg%d.(%d,%d,%d)-(%d,%d,%d).%d",
					(int)pNet->GetKey(),
					pWire->m_pPointS->X(),pWire->m_pPointS->Y(),pWire->m_pPointS->Z(),
					pWire->m_pPointE->X(),pWire->m_pPointE->Y(),pWire->m_pPointE->Z(),j);
				for (k=0;k<pSegmentList->size();k++)
				{
					CSegment*	pCurSegment	=	(*pSegmentList)[k];
					sprintf(&cName[strlen(cName)],"=(%d,%d,%d)->(%d,%d,%d)",
						pCurSegment->m_pPointS->X(),pCurSegment->m_pPointS->Y(),pCurSegment->m_pPointS->Z(),
						pCurSegment->m_pPointE->X(),pCurSegment->m_pPointE->Y(),pCurSegment->m_pPointE->Z());
				}
#else
				cName[0]	=	NULL;		
#endif
			}
			else if(iMode&PROP_PARAM_SOLVER_MOSEK)
			{
				sprintf(cName,"X%d",ILPSolver.GetNumVariable()+1);
			}

			// each variable means a set of Segments which is a possible routing for this Wire [6/22/2006 thyeros]			
			// Variable[xxx] contains its index in problem matrix (column) [6/22/2006 thyeros]

			// layer assignment cost [9/22/2006 thyeros]
			if(iMode&PROP_PARAM_BOXR_ILPMAX)
			{
				double	dCost = 1+((pDesign->m_Param.GetProp()&PROP_PARAM_MULTILAYER)? 1.0/CWire::GetSegmentListCost(pSegmentList)/s:0);
				
				Variable[(ADDRESS)pSegmentList]	=	ILPSolver.AddVariable(cName,dCost,TRUE,0,TRUE,1);
			}
			else if(iMode&(PROP_PARAM_BOXR_ILPHYD|PROP_PARAM_BOXR_ILPMIN))
			{
				double	dCost =	0;
				
				Variable[(ADDRESS)pSegmentList]	=	ILPSolver.AddVariable(cName,dCost,TRUE,0,TRUE,1);
			}
			
			InverseVariable.push_back(pSegmentList);
			
		}// for each segment list [6/22/2006 thyeros]
				
		ILPSolver.PrepareCoeffBuffer(iNumSegmentList+1,Variable.size());
		

		if(iMode&PROP_PARAM_SOLVER_GLPK)
		{
#ifdef _DEBUG
			sprintf(cName,"v-wire%d.(%d,%d)-(%d,%d)",(int)pNet->GetKey(),pWire->m_pPointS->X(),pWire->m_pPointS->Y(),pWire->m_pPointE->X(),pWire->m_pPointE->Y());
#else
			cName[0]	=	NULL;		
#endif
		}
		else if(iMode&PROP_PARAM_SOLVER_MOSEK)
		{
			sprintf(cName,"Z%d",ILPSolver.GetNumConstraint()+1);
		}

		// add constraint such that one of segment lists for each wire should be selected [6/22/2006 thyeros]
		if(iMode&PROP_PARAM_BOXR_ILPMAX)								ILPSolver.AddConstraint(cName,iNumSegmentList,TRUE,0,TRUE,1);
		else if(iMode&(PROP_PARAM_BOXR_ILPHYD|PROP_PARAM_BOXR_ILPMIN))	ILPSolver.AddConstraint(cName,iNumSegmentList,TRUE,1,TRUE,1);	
	}// for each wire [6/22/2006 thyeros]
	
	InverseVariable.resize(InverseVariable.size());
	assert(Variable.size()==InverseVariable.size()-1);
	iNumVariable	=	Variable.size();

	//////////////////////////////////////////////////////////////////////////
	// depending on the obj, needs max utilization variable [6/28/2006 thyeros]
	//////////////////////////////////////////////////////////////////////////
	if(iMode&PROP_PARAM_BOXR_ILPMAX)
	{
		iD	=	-1;
	}
	else if(iMode&(PROP_PARAM_BOXR_ILPHYD|PROP_PARAM_BOXR_ILPMIN))
	{
		iD	=	ILPSolver.AddVariable("v-D",1,TRUE,0,FALSE,MAX_NUMBER);

		if(iMode&PROP_PARAM_BOXR_ILPHYD)
		{
			ILPSolver.SetCoeffIndex(1,iD);
			ILPSolver.AddConstraint("c-D",1,TRUE,0,TRUE,pDesign->GetCapacity(GET_MODE_MAX)+1);
		}
	}
	
	//////////////////////////////////////////////////////////////////////////
	// congestion constraint for each boundary [6/22/2006 thyeros]
	//////////////////////////////////////////////////////////////////////////
	for(set<CBoundary*>::iterator itr=Boundary.begin(),end=Boundary.end();itr!=end;++itr)
	{
		CBoundary*	pBoundary	=	*itr;//->second;
		int	iNumSegmentList		=	pBoundary->GetNumSegmentList();
		
		ILPSolver.PrepareCoeffBuffer(iNumSegmentList+2);
		
		for (i=0;i<iNumSegmentList;++i)
		{
			vector<CSegment*>*	pSegmentList	=	pBoundary->GetSegmentList(i);
			
			assert(Variable.find((ADDRESS)pSegmentList)!=Variable.end());			
			ILPSolver.SetCoeffIndex(i+1,Variable.find((ADDRESS)pSegmentList)->second);

			// each segment needs its own required width and spacing [2/3/2007 thyeros]
			ILPSolver.SetCoeff(i+1,2);//pBoundary->GetParent()->GetDesignRule(GET_DR_MIN_WIR_SPACING)+pSegmentList->at(0)->GetWidth());
		}

		if(iMode&PROP_PARAM_SOLVER_GLPK)
		{
#ifdef _DEBUG
			sprintf(cName,"v-bnd(%d,%d,%d)_of_%d",pBoundary->X(),pBoundary->Y(),pBoundary->Z(),pBoundary->GetCapacity(GET_MODE_ACAP));
#else
			cName[0]	=	NULL;		
#endif
		}
		else if(iMode&PROP_PARAM_SOLVER_MOSEK)
		{
			sprintf(cName,"Y%d",ILPSolver.GetNumConstraint());
		}

		if(iMode&PROP_PARAM_BOXR_ILPMAX)
		{
			assert(iD==-1);
			ILPSolver.AddConstraint(cName,iNumSegmentList,TRUE,0,TRUE,pBoundary->GetCapacity(GET_MODE_ACAP));
		}
		else if(iMode&(PROP_PARAM_BOXR_ILPHYD|PROP_PARAM_BOXR_ILPMIN))
		{
			assert(iD>0);
			ILPSolver.SetCoeffIndex(i+1,iD);

			ILPSolver.SetCoeff(i+1,-1.0*pBoundary->GetParent()->GetCapacity(GET_MODE_MAX)/pDesign->GetCapacity(GET_MODE_MAX));	
			ILPSolver.AddConstraint(cName,iNumSegmentList+1,FALSE,0,TRUE,-pBoundary->GetCapacity(GET_MODE_OCAP));

			// make it back to one for other variables [6/26/2006 thyeros]
			ILPSolver.SetCoeff(i+1,1);
		}
		
		pBoundary->ClearSegmentList();	
		assert(pBoundary->GetNumSegmentList()==0);
	}
	
	CObject::PrintMsg2("..#v=%d #c=%d ",ILPSolver.GetNumVariable(),ILPSolver.GetNumConstraint());
	
	int	iSolMode	=	0;
	if(iMode&PROP_PARAM_SOLVER_GLPK)
	{
		if(iMode&PROP_PARAM_BOXR_ILPMAX)
		{
			if(iMode&PROP_PARAM_BOXR_ILP_RNDUP)		iSolMode	=	SOL_OPTION_MAX|SOL_OPTION_SIMPLEX;
			else									iSolMode	=	SOL_OPTION_MAX|SOL_OPTION_MIP;
		}
		else if(iMode&PROP_PARAM_BOXR_ILPMIN)
		{
			if(iMode&PROP_PARAM_BOXR_ILP_RNDUP)		iSolMode	=	SOL_OPTION_MIN|SOL_OPTION_SIMPLEX;
			else									iSolMode	=	SOL_OPTION_MIN|SOL_OPTION_MIP;
		}
		else if(iMode&PROP_PARAM_BOXR_ILPHYD)
		{
			//////////////////////////////////////////////////////////////////////////
			// heuristically decide the better approach [6/29/2006 thyeros]
			// check # of constratins [6/29/2006 thyeros]
			//////////////////////////////////////////////////////////////////////////
			if(iMode&PROP_PARAM_BOXR_ILP_RNDUP)		iSolMode	=	ILPSolver.GetNumConstraint()>MAX_ILP_CONSTRAINT? 0:SOL_OPTION_MIN|SOL_OPTION_SIMPLEX;
			else									iSolMode	=	ILPSolver.GetNumConstraint()>MAX_ILP_CONSTRAINT? 0:SOL_OPTION_MIN|SOL_OPTION_MIP;
		}

		if(iSolMode)
		{
			//////////////////////////////////////////////////////////////////////////
			// solve the problem [6/24/2006 thyeros]
			//////////////////////////////////////////////////////////////////////////
			double	dObjectValue	=	0;
			ILPSolver.PrepareSolutionBuffer(InverseVariable.size());			

#ifdef _DEBUG
			//sprintf(cName,"%s_p%d.txt",pDesign->m_Param.m_cInput_File,pDesign->m_iLoop-1);
			//ILPSolver.Print(cName,SOL_PRINT_PRO);
#endif
	
			if(ILPSolver.Solve(iSolMode,&dObjectValue))
			{
#ifdef _DEBUG
				//sprintf(cName,"%s_s%d.txt",pDesign->GetName(),pDesign->m_iLoop-1);
				//ILPSolver.Print(cName,SOL_PRINT_SOL);
#endif
				CObject::PrintMsg2("*o=%.2f\t",dObjectValue);

				if(iMode&PROP_PARAM_BOXR_ILP_RNDUP)		ILPSolver.RoundUp(0.5);

				if(iMode&PROP_PARAM_BOXR_ILPHYD&&(int)dObjectValue>pDesign->GetCapacity(GET_MODE_MAX))
				{
					CObject::PrintMsg2("=give up solution\n");
				}
				else
				{
					//////////////////////////////////////////////////////////////////////////
					// retrieve the solution [6/24/2006 thyeros]
					//////////////////////////////////////////////////////////////////////////	
					for (i=1;i<=iNumVariable;++i)
					{
						if(ILPSolver.GetSolution(i))
						{	
							CSegment*	pSegment	=	(*InverseVariable[i])[0];

//							assert(pSegment->GetParent()->m_pRoutedSegmentList==NULL);
							pSegment->GetParent()->m_pRoutedSegmentList	=	InverseVariable[i];	
							assert(pSegment->GetParent()->m_pRoutedSegmentList->size());
						}
					}		
				}
#ifdef _DEBUG
				if(iD>0)
				{
					if((int)ILPSolver.GetSolution(iD)!=(int)dObjectValue)
					{
						printf("ERROR: ILP objective iD=%d(%f) vs dObjectValue=%d(%f)\n",
							(int)ILPSolver.GetSolution(iD),ILPSolver.GetSolution(iD),
							(int)dObjectValue,dObjectValue);
					}
					assert((int)ILPSolver.GetSolution(iD)==(int)dObjectValue);
				}
#endif
			}
		}
		else
		{
			CObject::PrintMsg2("\t= discarded (maxc %d)\n",MAX_ILP_CONSTRAINT);
		}
	}
	else if(iMode&PROP_PARAM_SOLVER_MOSEK)
	{
		sprintf(cName,"%s_l%d.mps",pDesign->m_Param.m_cInput_File,pDesign->m_iLoop-1);
		//sprintf(cName,"br.mps");
		ILPSolver.Write(cName,SOL_FORMAT_FREEMPS);

		// run mosek [10/13/2006 thyeros]
		char cLine[MAX_BUFFER_STR];

		sprintf(cLine,"mosek -max %s -d MSK_IPAR_READ_MPS_FORMAT 2 -d MSK_IPAR_WRITE_SOL_CONSTRAINTS 0 -d MSK_IPAR_WRITE_BAS_CONSTRAINTS 0 -d MSK_IPAR_WRITE_BAS_HEAD 0 -d MSK_IPAR_WRITE_BAS_VARIABLES 0 -d MSK_IPAR_LOG 0",cName);

		CreateAndWait(cLine);

		sprintf(cName,"%s_l%d.sol",pDesign->m_Param.m_cInput_File,pDesign->m_iLoop-1);
		for(FILE* pFile=fopen(cName,"rt");fgets(cLine,sizeof(cLine),pFile);)
		{
			char*	pToken	=	strtok(cLine," \t\n");
			pToken	=	strtok(NULL," \t\n");

			if(pToken==NULL)	continue;

			switch(pToken[0]){
				case 'X':
					{
						int		iIndex			=	atoi(pToken+1);
						strtok(NULL," \t\n");
						if(atof(strtok(NULL," \t\n"))>=0.5)
						{
							CSegment*	pSegment	=	(*InverseVariable[iIndex])[0];

							assert(pSegment->GetParent()->m_pRoutedSegmentList==NULL);
							pSegment->GetParent()->m_pRoutedSegmentList	=	InverseVariable[iIndex];	
							assert(pSegment->GetParent()->m_pRoutedSegmentList->size());
						}
					}
					break;
				default:
					break;
			}	
		}
	}

	for(i=0,s=pWireList->size();i<s;++i)
	{
		CWire*	pWire	=	(*pWireList)[i];
		if(pWire==NULL)	continue;

		CNet*	pNet	=	pWire->GetParent();

		if(pNet==NULL)
		{
			pWire->Delete();//SAFE_DEL(pWire);

			// mark it is routed and DELETED [6/23/2006 thyeros]
			(*pWireList)[i]	=	NULL;
			
			++iNumWireRouted;

			// must be discarded [7/1/2006 thyeros]
			continue;
		}

		if(pWire->m_pRoutedSegmentList)
		{
			assert(pWire->m_pRoutedSegmentList->size());

/*			if(pNet->GetKey()==11)
			{
				pNet->Print(stdout,PRINT_MODE_TEXT);
				pWire->Print(stdout,PRINT_MODE_TEXT);

				printf("==============\n");				

				vector<CSegment*>* pSegmentList	=	pWire->m_pRoutedSegmentList;
				for(int k=0;k<pSegmentList->size();k++)
				{
					pSegmentList->at(k)->Print(stdout,PRINT_MODE_TEXT);	
				}
			}
*/

			pWire->Pupate();
			pWire->Delete();//SAFE_DEL(pWire);

			// mark it is routed and DELETED [6/23/2006 thyeros]
			(*pWireList)[i]	=	NULL;
	
			++iNumWireRouted;

			pNet->Refine();
		}
		else
		{
			pWire->ClearSegmentList();
		}

#ifdef _DEBUG
		if(pNet->GetKey()==pDesign->m_iDebugNet)
		{
			pDesign->PrintFile("debug.m",PRINT_MODE_MATLAB);
			pNet->PrintFile(">debug.m",PRINT_MODE_MATLAB);
		}
#endif
	}
	
	return	iNumWireRouted;
}